

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool __thiscall llvm::StringRef::getAsInteger(StringRef *this,uint Radix,APInt *Result)

{
  char cVar1;
  uint uVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  bool bVar5;
  uint local_174;
  undefined1 local_170 [4];
  uint CharVal;
  APInt local_160;
  undefined1 local_150 [8];
  APInt CharAP;
  APInt RadixAP;
  uint local_11c;
  uint BitWidth;
  undefined1 local_110 [3];
  bool IsPowerOf2Radix;
  uint Log2Radix;
  undefined1 local_f0 [8];
  StringRef Str;
  APInt *Result_local;
  uint Radix_local;
  StringRef *this_local;
  unsigned_long local_b8 [3];
  undefined1 *local_a0;
  undefined1 local_98 [16];
  unsigned_long local_88 [3];
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  local_f0 = (undefined1  [8])this->Data;
  Str.Data = (char *)this->Length;
  Str.Length = (size_t)Result;
  Result_local._4_4_ = Radix;
  if (Radix == 0) {
    Result_local._4_4_ = GetAutoSenseRadix((StringRef *)local_f0);
  }
  if (Result_local._4_4_ < 2 || 0x24 < Result_local._4_4_) {
    __assert_fail("Radix > 1 && Radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringRef.cpp"
                  ,0x204,"bool llvm::StringRef::getAsInteger(unsigned int, APInt &) const");
  }
  local_40 = local_f0;
  if (Str.Data == (char *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    while( true ) {
      local_48 = local_f0;
      bVar5 = false;
      if (Str.Data != (char *)0x0) {
        cVar1 = front((StringRef *)local_f0);
        bVar5 = cVar1 == '0';
      }
      if (!bVar5) break;
      local_70 = local_f0;
      local_88[2] = 1;
      local_88[1] = 0xffffffffffffffff;
      puVar3 = std::min<unsigned_long>(local_88 + 2,(unsigned_long *)&Str);
      local_88[2] = *puVar3;
      pcVar4 = (char *)((long)local_f0 + local_88[2]);
      local_88[0] = (long)Str.Data - local_88[2];
      puVar3 = std::min<unsigned_long>(local_88 + 1,local_88);
      Str.Data = (char *)*puVar3;
      local_28 = local_68;
      local_f0 = (undefined1  [8])pcVar4;
      local_38 = Str.Data;
      local_30 = pcVar4;
    }
    local_50 = local_f0;
    if (Str.Data == (char *)0x0) {
      APInt::APInt((APInt *)local_110,0x40,0,false);
      APInt::operator=((APInt *)Str.Length,(APInt *)local_110);
      APInt::~APInt((APInt *)local_110);
      this_local._7_1_ = false;
    }
    else {
      for (BitWidth = 0; (uint)(1 << ((byte)BitWidth & 0x1f)) < Result_local._4_4_;
          BitWidth = BitWidth + 1) {
      }
      bVar5 = 1 << ((byte)BitWidth & 0x1f) != Result_local._4_4_;
      local_11c = BitWidth * (int)Str.Data;
      uVar2 = APInt::getBitWidth((APInt *)Str.Length);
      if (local_11c < uVar2) {
        local_11c = APInt::getBitWidth((APInt *)Str.Length);
      }
      else {
        uVar2 = APInt::getBitWidth((APInt *)Str.Length);
        if (uVar2 < local_11c) {
          APInt::zext((APInt *)&RadixAP.BitWidth,(uint)Str.Length);
          APInt::operator=((APInt *)Str.Length,(APInt *)&RadixAP.BitWidth);
          APInt::~APInt((APInt *)&RadixAP.BitWidth);
        }
      }
      APInt::APInt((APInt *)&CharAP.BitWidth);
      APInt::APInt((APInt *)local_150);
      if (bVar5) {
        APInt::APInt(&local_160,local_11c,(ulong)Result_local._4_4_,false);
        APInt::operator=((APInt *)&CharAP.BitWidth,&local_160);
        APInt::~APInt(&local_160);
        APInt::APInt((APInt *)local_170,local_11c,0,false);
        APInt::operator=((APInt *)local_150,(APInt *)local_170);
        APInt::~APInt((APInt *)local_170);
      }
      APInt::operator=((APInt *)Str.Length,0);
      while (local_58 = local_f0, Str.Data != (char *)0x0) {
        cVar1 = operator[]((StringRef *)local_f0,0);
        if ((cVar1 < '0') || (cVar1 = operator[]((StringRef *)local_f0,0), '9' < cVar1)) {
          cVar1 = operator[]((StringRef *)local_f0,0);
          if ((cVar1 < 'a') || (cVar1 = operator[]((StringRef *)local_f0,0), 'z' < cVar1)) {
            cVar1 = operator[]((StringRef *)local_f0,0);
            if ((cVar1 < 'A') || (cVar1 = operator[]((StringRef *)local_f0,0), 'Z' < cVar1)) {
              this_local._7_1_ = true;
              goto LAB_001dddad;
            }
            cVar1 = operator[]((StringRef *)local_f0,0);
            local_174 = (int)cVar1 - 0x37;
          }
          else {
            cVar1 = operator[]((StringRef *)local_f0,0);
            local_174 = (int)cVar1 - 0x57;
          }
        }
        else {
          cVar1 = operator[]((StringRef *)local_f0,0);
          local_174 = (int)cVar1 - 0x30;
        }
        if (Result_local._4_4_ <= local_174) {
          this_local._7_1_ = true;
          goto LAB_001dddad;
        }
        if (bVar5) {
          APInt::operator*=((APInt *)Str.Length,(APInt *)&CharAP.BitWidth);
          APInt::operator=((APInt *)local_150,(ulong)local_174);
          APInt::operator+=((APInt *)Str.Length,(APInt *)local_150);
        }
        else {
          APInt::operator<<=((APInt *)Str.Length,BitWidth);
          APInt::operator|=((APInt *)Str.Length,(ulong)local_174);
        }
        local_a0 = local_f0;
        local_b8[2] = 1;
        local_b8[1] = 0xffffffffffffffff;
        puVar3 = std::min<unsigned_long>(local_b8 + 2,(unsigned_long *)&Str);
        local_b8[2] = *puVar3;
        pcVar4 = (char *)((long)local_f0 + local_b8[2]);
        local_b8[0] = (long)Str.Data - local_b8[2];
        puVar3 = std::min<unsigned_long>(local_b8 + 1,local_b8);
        local_10 = local_98;
        Str.Data = (char *)*puVar3;
        local_f0 = (undefined1  [8])pcVar4;
        local_20 = Str.Data;
        local_18 = pcVar4;
      }
      this_local._7_1_ = false;
LAB_001dddad:
      APInt::~APInt((APInt *)local_150);
      APInt::~APInt((APInt *)&CharAP.BitWidth);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StringRef::getAsInteger(unsigned Radix, APInt &Result) const {
  StringRef Str = *this;

  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  assert(Radix > 1 && Radix <= 36);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Skip leading zeroes.  This can be a significant improvement if
  // it means we don't need > 64 bits.
  while (!Str.empty() && Str.front() == '0')
    Str = Str.substr(1);

  // If it was nothing but zeroes....
  if (Str.empty()) {
    Result = APInt(64, 0);
    return false;
  }

  // (Over-)estimate the required number of bits.
  unsigned Log2Radix = 0;
  while ((1U << Log2Radix) < Radix) Log2Radix++;
  bool IsPowerOf2Radix = ((1U << Log2Radix) == Radix);

  unsigned BitWidth = Log2Radix * Str.size();
  if (BitWidth < Result.getBitWidth())
    BitWidth = Result.getBitWidth(); // don't shrink the result
  else if (BitWidth > Result.getBitWidth())
    Result = Result.zext(BitWidth);

  APInt RadixAP, CharAP; // unused unless !IsPowerOf2Radix
  if (!IsPowerOf2Radix) {
    // These must have the same bit-width as Result.
    RadixAP = APInt(BitWidth, Radix);
    CharAP = APInt(BitWidth, 0);
  }

  // Parse all the bytes of the string given this radix.
  Result = 0;
  while (!Str.empty()) {
    unsigned CharVal;
    if (Str[0] >= '0' && Str[0] <= '9')
      CharVal = Str[0]-'0';
    else if (Str[0] >= 'a' && Str[0] <= 'z')
      CharVal = Str[0]-'a'+10;
    else if (Str[0] >= 'A' && Str[0] <= 'Z')
      CharVal = Str[0]-'A'+10;
    else
      return true;

    // If the parsed value is larger than the integer radix, the string is
    // invalid.
    if (CharVal >= Radix)
      return true;

    // Add in this character.
    if (IsPowerOf2Radix) {
      Result <<= Log2Radix;
      Result |= CharVal;
    } else {
      Result *= RadixAP;
      CharAP = CharVal;
      Result += CharAP;
    }

    Str = Str.substr(1);
  }

  return false;
}